

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Vec3 *vectorArray,size_t length)

{
  long lVar1;
  size_t sVar2;
  GLfloat *pGVar3;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  UniformBinder UStack_48;
  vector<float,_std::allocator<float>_> local_38;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_38,length * 3,(allocator_type *)&UStack_48);
  if (length != 0) {
    lVar1 = 8;
    sVar2 = length;
    do {
      *(undefined4 *)
       ((long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + lVar1 + -8) =
           *(undefined4 *)((long)vectorArray + lVar1 + -8);
      *(undefined4 *)
       ((long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + lVar1 + -4) =
           *(undefined4 *)((long)vectorArray + lVar1 + -4);
      *(undefined4 *)
       ((long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + lVar1) =
           *(undefined4 *)((long)&vectorArray->x + lVar1);
      lVar1 = lVar1 + 0xc;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  UniformBinder::UniformBinder(&UStack_48,this,name);
  if (UStack_48.location != -1) {
    pGVar3 = (GLfloat *)0x0;
    if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pGVar3 = local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (*sf_glad_glUniform3fvARB)(UStack_48.location,(GLsizei)length,pGVar3);
  }
  UniformBinder::~UniformBinder(&UStack_48);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Vec3* vectorArray, std::size_t length)
{
    std::vector<float> contiguous = flatten(vectorArray, length);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniform3fv(binder.location, static_cast<GLsizei>(length), !contiguous.empty() ? &contiguous[0] : NULL));
}